

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void __thiscall GB::StepPPU_Mode3(GB *this,Tick mode_tick)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  byte *pbVar4;
  bool bVar5;
  u8 uVar6;
  u8 pal_index;
  Tick mode_tick_local;
  GB *this_local;
  
  if (0x169 < mode_tick) {
    __assert_fail("mode_tick < 362",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/binji[P]gabby/src/gabby.cc"
                  ,0x72a,"void GB::StepPPU_Mode3(Tick)");
  }
  switch(mode_tick) {
  case 0:
    if (((this->s).ppu_window & 1U) == 0) {
      (this->s).ppu_draw_y = (this->s).ppu_line_y + (this->s).io[0x42];
      (this->s).ppu_map_addr =
           ((this->s).io[0x40] & 8) << 7 | (ushort)((int)((this->s).io[0x43] & 0xf8) >> 3);
    }
    else {
      (this->s).ppu_draw_y = (this->s).ppu_line_y - (this->s).io[0x4a];
      (this->s).ppu_map_addr = ((this->s).io[0x40] & 0x40) << 4;
    }
    (this->s).ppu_map_addr = (this->s).ppu_map_addr | ((this->s).ppu_draw_y & 0xf8) << 2 | 0x1800;
    (this->s).ppu_map = (this->s).vram[(this->s).ppu_map_addr];
    break;
  case 4:
  case 0x10:
  case 0x20:
  case 0x30:
  case 0x40:
  case 0x50:
  case 0x60:
  case 0x70:
  case 0x80:
  case 0x90:
  case 0xa0:
  case 0xb0:
  case 0xc0:
  case 0xd0:
  case 0xe0:
  case 0xf0:
  case 0x100:
  case 0x110:
  case 0x120:
  case 0x130:
  case 0x140:
  case 0x150:
  case 0x160:
    (this->s).ppu_tile_addr = ((this->s).ppu_draw_y & 7) << 1;
    if (((this->s).io[0x40] & 0x10) == 0) {
      (this->s).ppu_tile_addr = (this->s).ppu_tile_addr | (char)(this->s).ppu_map * 0x10 + 0x1000U;
    }
    else {
      (this->s).ppu_tile_addr = (this->s).ppu_tile_addr | (ushort)(this->s).ppu_map << 4;
    }
    uVar3 = (this->s).ppu_tile_addr;
    (this->s).ppu_tile_addr = uVar3 + 1;
    (this->s).ppu_next_tile[0] = (this->s).vram[uVar3];
    break;
  case 8:
  case 0x14:
  case 0x24:
  case 0x34:
  case 0x44:
  case 0x54:
  case 100:
  case 0x74:
  case 0x84:
  case 0x94:
  case 0xa4:
  case 0xb4:
  case 0xc4:
  case 0xd4:
  case 0xe4:
  case 0xf4:
  case 0x104:
  case 0x114:
  case 0x124:
  case 0x134:
  case 0x144:
  case 0x154:
  case 0x164:
    (this->s).ppu_next_tile[1] = (this->s).vram[(this->s).ppu_tile_addr];
    break;
  case 0xc:
    if (((this->s).ppu_window & 1U) != 0) goto switchD_001131f9_caseD_1c;
    goto LAB_001132f0;
  case 0x18:
  case 0x28:
  case 0x38:
  case 0x48:
  case 0x58:
  case 0x68:
  case 0x78:
  case 0x88:
  case 0x98:
  case 0xa8:
  case 0xb8:
  case 200:
  case 0xd8:
  case 0xe8:
  case 0xf8:
  case 0x108:
  case 0x118:
  case 0x128:
  case 0x138:
  case 0x148:
  case 0x158:
  case 0x168:
    break;
  case 0x1c:
  case 0x2c:
  case 0x3c:
  case 0x4c:
  case 0x5c:
  case 0x6c:
  case 0x7c:
  case 0x8c:
  case 0x9c:
  case 0xac:
  case 0xbc:
  case 0xcc:
  case 0xdc:
  case 0xec:
  case 0xfc:
  case 0x10c:
  case 0x11c:
  case 300:
  case 0x13c:
  case 0x14c:
  case 0x15c:
switchD_001131f9_caseD_1c:
    (this->s).ppu_map_addr = (this->s).ppu_map_addr & 0xffe0 | (this->s).ppu_map_addr + 1 & 0x1f;
LAB_001132f0:
    (this->s).ppu_map = (this->s).vram[(this->s).ppu_map_addr];
    (this->s).ppu_tile[0] = (this->s).ppu_next_tile[0];
    (this->s).ppu_tile[1] = (this->s).ppu_next_tile[1];
  }
  bVar5 = falling((this->s).tick);
  if (bVar5) {
    if ((this->s).ppu_stall == '\0') {
      bVar1 = (this->s).ppu_tile[1];
      bVar2 = (this->s).io[0x47];
      pbVar4 = (this->s).ppu_pixel;
      (this->s).ppu_pixel = pbVar4 + 1;
      *pbVar4 = (byte)((int)(uint)bVar2 >>
                      (((byte)((int)(uint)bVar1 >> 6) & 2 |
                       (byte)((int)(uint)(this->s).ppu_tile[0] >> 7)) << 1)) & 3;
      uVar6 = (this->s).ppu_line_x + '\x01';
      (this->s).ppu_line_x = uVar6;
      if (uVar6 == 0xa0) {
        SetPPUMode(this,'\0');
      }
    }
    else {
      (this->s).ppu_stall = (this->s).ppu_stall + 0xff;
    }
    (this->s).ppu_tile[0] = (this->s).ppu_tile[0] << 1;
    (this->s).ppu_tile[1] = (this->s).ppu_tile[1] << 1;
    if ((((((this->s).ppu_window & 1U) == 0) && (((this->s).io[0x40] & 0x20) != 0)) &&
        ((this->s).io[0x4a] <= (this->s).ppu_line_y)) &&
       (mode_tick == (int)(((this->s).io[0x4b] + 6) * 2))) {
      (this->s).ppu_stall = '\x06';
      (this->s).ppu_mode_start_tick = (this->s).tick + 2;
      (this->s).ppu_window = true;
    }
  }
  return;
}

Assistant:

void GB::StepPPU_Mode3(Tick mode_tick) {
  assert(mode_tick < 362);
  switch (mode_tick) {
    case 0: {
      if (s.ppu_window) {
        s.ppu_draw_y = s.ppu_line_y - s.io[WY];
        s.ppu_map_addr = (s.io[LCDC] & 0x40) << 4;
      } else {
        s.ppu_draw_y = s.ppu_line_y + s.io[SCY];
        s.ppu_map_addr = ((s.io[LCDC] & 8) << 7) | ((s.io[SCX] & 0xf8) >> 3);
      }
      s.ppu_map_addr |= 0x1800 | ((s.ppu_draw_y & 0xf8) << 2);
      s.ppu_map = s.vram[s.ppu_map_addr];
      break;
    }

    case 12:
      if (!s.ppu_window) { goto no_increment; }
      // Fallthrough.

    case 28: case 44: case 60: case 76: case 92: case 108:
    case 124: case 140: case 156: case 172: case 188: case 204: case 220:
    case 236: case 252: case 268: case 284: case 300: case 316: case 332:
    case 348:
      s.ppu_map_addr = (s.ppu_map_addr & ~31) | ((s.ppu_map_addr + 1) & 31);

    no_increment:
      // Next map addr.
      s.ppu_map = s.vram[s.ppu_map_addr];
      s.ppu_tile[0] = s.ppu_next_tile[0];
      s.ppu_tile[1] = s.ppu_next_tile[1];
      break;

    case 4: case 16: case 32: case 48: case 64: case 80: case 96: case 112:
    case 128: case 144: case 160: case 176: case 192: case 208: case 224:
    case 240: case 256: case 272: case 288: case 304: case 320: case 336:
    case 352:
      // Fetch plane 0.
      s.ppu_tile_addr = (s.ppu_draw_y & 0x7) << 1;
      if (s.io[LCDC] & 0x10) {
        s.ppu_tile_addr |= (s.ppu_map << 4);
      } else {
        s.ppu_tile_addr |= (0x1000 + ((s16)(s8)s.ppu_map << 4));
      }
      s.ppu_next_tile[0] = s.vram[s.ppu_tile_addr++];
      break;

    case 8: case 20: case 36: case 52: case 68: case 84: case 100: case 116:
    case 132: case 148: case 164: case 180: case 196: case 212: case 228:
    case 244: case 260: case 276: case 292: case 308: case 324: case 340:
    case 356:
      // Fetch plane 1.
      s.ppu_next_tile[1] = s.vram[s.ppu_tile_addr];
      break;

    case 24: case 40: case 56: case 72: case 88: case 104: case 120:
    case 136: case 152: case 168: case 184: case 200: case 216: case 232:
    case 248: case 264: case 280: case 296: case 312: case 328: case 344:
    case 360:
      // Sprite window.
      break;
  }

  if (falling(s.tick)) {
    if (s.ppu_stall == 0) {
      u8 pal_index = ((s.ppu_tile[1] >> 6) & 2) | (s.ppu_tile[0] >> 7);
      *s.ppu_pixel++ = (s.io[BGP] >> (pal_index * 2)) & 3;
      if (++s.ppu_line_x == 160) {
        SetPPUMode(0);
      }
    } else {
      --s.ppu_stall;
    }

    s.ppu_tile[0] <<= 1;
    s.ppu_tile[1] <<= 1;

    if (!s.ppu_window && (s.io[LCDC] & 0x20) && s.ppu_line_y >= s.io[WY] &&
        mode_tick == (s.io[WX] + 6) * 2) {
      s.ppu_stall = 6;
      s.ppu_mode_start_tick = s.tick + 2;
      s.ppu_window = true;
    }
  }
}